

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xmlregexp.c
# Opt level: O0

void xmlRegPrintAtomType(FILE *output,xmlRegAtomType type)

{
  xmlRegAtomType type_local;
  FILE *output_local;
  
  switch(type) {
  case XML_REGEXP_EPSILON:
    fprintf((FILE *)output,"epsilon ");
    break;
  case XML_REGEXP_CHARVAL:
    fprintf((FILE *)output,"charval ");
    break;
  case XML_REGEXP_RANGES:
    fprintf((FILE *)output,"ranges ");
    break;
  case XML_REGEXP_SUBREG:
    fprintf((FILE *)output,"subexpr ");
    break;
  case XML_REGEXP_STRING:
    fprintf((FILE *)output,"string ");
    break;
  case XML_REGEXP_ANYCHAR:
    fprintf((FILE *)output,"anychar ");
    break;
  case XML_REGEXP_ANYSPACE:
    fprintf((FILE *)output,"anyspace ");
    break;
  case XML_REGEXP_NOTSPACE:
    fprintf((FILE *)output,"notspace ");
    break;
  case XML_REGEXP_INITNAME:
    fprintf((FILE *)output,"initname ");
    break;
  case XML_REGEXP_NOTINITNAME:
    fprintf((FILE *)output,"notinitname ");
    break;
  case XML_REGEXP_NAMECHAR:
    fprintf((FILE *)output,"namechar ");
    break;
  case XML_REGEXP_NOTNAMECHAR:
    fprintf((FILE *)output,"notnamechar ");
    break;
  case XML_REGEXP_DECIMAL:
    fprintf((FILE *)output,"decimal ");
    break;
  case XML_REGEXP_NOTDECIMAL:
    fprintf((FILE *)output,"notdecimal ");
    break;
  case XML_REGEXP_REALCHAR:
    fprintf((FILE *)output,"realchar ");
    break;
  case XML_REGEXP_NOTREALCHAR:
    fprintf((FILE *)output,"notrealchar ");
    break;
  case XML_REGEXP_LETTER:
    fprintf((FILE *)output,"LETTER ");
    break;
  case XML_REGEXP_LETTER_UPPERCASE:
    fprintf((FILE *)output,"LETTER_UPPERCASE ");
    break;
  case XML_REGEXP_LETTER_LOWERCASE:
    fprintf((FILE *)output,"LETTER_LOWERCASE ");
    break;
  case XML_REGEXP_LETTER_TITLECASE:
    fprintf((FILE *)output,"LETTER_TITLECASE ");
    break;
  case XML_REGEXP_LETTER_MODIFIER:
    fprintf((FILE *)output,"LETTER_MODIFIER ");
    break;
  case XML_REGEXP_LETTER_OTHERS:
    fprintf((FILE *)output,"LETTER_OTHERS ");
    break;
  case XML_REGEXP_MARK:
    fprintf((FILE *)output,"MARK ");
    break;
  case XML_REGEXP_MARK_NONSPACING:
    fprintf((FILE *)output,"MARK_NONSPACING ");
    break;
  case XML_REGEXP_MARK_SPACECOMBINING:
    fprintf((FILE *)output,"MARK_SPACECOMBINING ");
    break;
  case XML_REGEXP_MARK_ENCLOSING:
    fprintf((FILE *)output,"MARK_ENCLOSING ");
    break;
  case XML_REGEXP_NUMBER:
    fprintf((FILE *)output,"NUMBER ");
    break;
  case XML_REGEXP_NUMBER_DECIMAL:
    fprintf((FILE *)output,"NUMBER_DECIMAL ");
    break;
  case XML_REGEXP_NUMBER_LETTER:
    fprintf((FILE *)output,"NUMBER_LETTER ");
    break;
  case XML_REGEXP_NUMBER_OTHERS:
    fprintf((FILE *)output,"NUMBER_OTHERS ");
    break;
  case XML_REGEXP_PUNCT:
    fprintf((FILE *)output,"PUNCT ");
    break;
  case XML_REGEXP_PUNCT_CONNECTOR:
    fprintf((FILE *)output,"PUNCT_CONNECTOR ");
    break;
  case XML_REGEXP_PUNCT_DASH:
    fprintf((FILE *)output,"PUNCT_DASH ");
    break;
  case XML_REGEXP_PUNCT_OPEN:
    fprintf((FILE *)output,"PUNCT_OPEN ");
    break;
  case XML_REGEXP_PUNCT_CLOSE:
    fprintf((FILE *)output,"PUNCT_CLOSE ");
    break;
  case XML_REGEXP_PUNCT_INITQUOTE:
    fprintf((FILE *)output,"PUNCT_INITQUOTE ");
    break;
  case XML_REGEXP_PUNCT_FINQUOTE:
    fprintf((FILE *)output,"PUNCT_FINQUOTE ");
    break;
  case XML_REGEXP_PUNCT_OTHERS:
    fprintf((FILE *)output,"PUNCT_OTHERS ");
    break;
  case XML_REGEXP_SEPAR:
    fprintf((FILE *)output,"SEPAR ");
    break;
  case XML_REGEXP_SEPAR_SPACE:
    fprintf((FILE *)output,"SEPAR_SPACE ");
    break;
  case XML_REGEXP_SEPAR_LINE:
    fprintf((FILE *)output,"SEPAR_LINE ");
    break;
  case XML_REGEXP_SEPAR_PARA:
    fprintf((FILE *)output,"SEPAR_PARA ");
    break;
  case XML_REGEXP_SYMBOL:
    fprintf((FILE *)output,"SYMBOL ");
    break;
  case XML_REGEXP_SYMBOL_MATH:
    fprintf((FILE *)output,"SYMBOL_MATH ");
    break;
  case XML_REGEXP_SYMBOL_CURRENCY:
    fprintf((FILE *)output,"SYMBOL_CURRENCY ");
    break;
  case XML_REGEXP_SYMBOL_MODIFIER:
    fprintf((FILE *)output,"SYMBOL_MODIFIER ");
    break;
  case XML_REGEXP_SYMBOL_OTHERS:
    fprintf((FILE *)output,"SYMBOL_OTHERS ");
    break;
  case XML_REGEXP_OTHER:
    fprintf((FILE *)output,"OTHER ");
    break;
  case XML_REGEXP_OTHER_CONTROL:
    fprintf((FILE *)output,"OTHER_CONTROL ");
    break;
  case XML_REGEXP_OTHER_FORMAT:
    fprintf((FILE *)output,"OTHER_FORMAT ");
    break;
  case XML_REGEXP_OTHER_PRIVATE:
    fprintf((FILE *)output,"OTHER_PRIVATE ");
    break;
  case XML_REGEXP_OTHER_NA:
    fprintf((FILE *)output,"OTHER_NA ");
    break;
  case XML_REGEXP_BLOCK_NAME:
    fprintf((FILE *)output,"BLOCK ");
  }
  return;
}

Assistant:

static void
xmlRegPrintAtomType(FILE *output, xmlRegAtomType type) {
    switch (type) {
        case XML_REGEXP_EPSILON:
	    fprintf(output, "epsilon "); break;
        case XML_REGEXP_CHARVAL:
	    fprintf(output, "charval "); break;
        case XML_REGEXP_RANGES:
	    fprintf(output, "ranges "); break;
        case XML_REGEXP_SUBREG:
	    fprintf(output, "subexpr "); break;
        case XML_REGEXP_STRING:
	    fprintf(output, "string "); break;
        case XML_REGEXP_ANYCHAR:
	    fprintf(output, "anychar "); break;
        case XML_REGEXP_ANYSPACE:
	    fprintf(output, "anyspace "); break;
        case XML_REGEXP_NOTSPACE:
	    fprintf(output, "notspace "); break;
        case XML_REGEXP_INITNAME:
	    fprintf(output, "initname "); break;
        case XML_REGEXP_NOTINITNAME:
	    fprintf(output, "notinitname "); break;
        case XML_REGEXP_NAMECHAR:
	    fprintf(output, "namechar "); break;
        case XML_REGEXP_NOTNAMECHAR:
	    fprintf(output, "notnamechar "); break;
        case XML_REGEXP_DECIMAL:
	    fprintf(output, "decimal "); break;
        case XML_REGEXP_NOTDECIMAL:
	    fprintf(output, "notdecimal "); break;
        case XML_REGEXP_REALCHAR:
	    fprintf(output, "realchar "); break;
        case XML_REGEXP_NOTREALCHAR:
	    fprintf(output, "notrealchar "); break;
        case XML_REGEXP_LETTER:
            fprintf(output, "LETTER "); break;
        case XML_REGEXP_LETTER_UPPERCASE:
            fprintf(output, "LETTER_UPPERCASE "); break;
        case XML_REGEXP_LETTER_LOWERCASE:
            fprintf(output, "LETTER_LOWERCASE "); break;
        case XML_REGEXP_LETTER_TITLECASE:
            fprintf(output, "LETTER_TITLECASE "); break;
        case XML_REGEXP_LETTER_MODIFIER:
            fprintf(output, "LETTER_MODIFIER "); break;
        case XML_REGEXP_LETTER_OTHERS:
            fprintf(output, "LETTER_OTHERS "); break;
        case XML_REGEXP_MARK:
            fprintf(output, "MARK "); break;
        case XML_REGEXP_MARK_NONSPACING:
            fprintf(output, "MARK_NONSPACING "); break;
        case XML_REGEXP_MARK_SPACECOMBINING:
            fprintf(output, "MARK_SPACECOMBINING "); break;
        case XML_REGEXP_MARK_ENCLOSING:
            fprintf(output, "MARK_ENCLOSING "); break;
        case XML_REGEXP_NUMBER:
            fprintf(output, "NUMBER "); break;
        case XML_REGEXP_NUMBER_DECIMAL:
            fprintf(output, "NUMBER_DECIMAL "); break;
        case XML_REGEXP_NUMBER_LETTER:
            fprintf(output, "NUMBER_LETTER "); break;
        case XML_REGEXP_NUMBER_OTHERS:
            fprintf(output, "NUMBER_OTHERS "); break;
        case XML_REGEXP_PUNCT:
            fprintf(output, "PUNCT "); break;
        case XML_REGEXP_PUNCT_CONNECTOR:
            fprintf(output, "PUNCT_CONNECTOR "); break;
        case XML_REGEXP_PUNCT_DASH:
            fprintf(output, "PUNCT_DASH "); break;
        case XML_REGEXP_PUNCT_OPEN:
            fprintf(output, "PUNCT_OPEN "); break;
        case XML_REGEXP_PUNCT_CLOSE:
            fprintf(output, "PUNCT_CLOSE "); break;
        case XML_REGEXP_PUNCT_INITQUOTE:
            fprintf(output, "PUNCT_INITQUOTE "); break;
        case XML_REGEXP_PUNCT_FINQUOTE:
            fprintf(output, "PUNCT_FINQUOTE "); break;
        case XML_REGEXP_PUNCT_OTHERS:
            fprintf(output, "PUNCT_OTHERS "); break;
        case XML_REGEXP_SEPAR:
            fprintf(output, "SEPAR "); break;
        case XML_REGEXP_SEPAR_SPACE:
            fprintf(output, "SEPAR_SPACE "); break;
        case XML_REGEXP_SEPAR_LINE:
            fprintf(output, "SEPAR_LINE "); break;
        case XML_REGEXP_SEPAR_PARA:
            fprintf(output, "SEPAR_PARA "); break;
        case XML_REGEXP_SYMBOL:
            fprintf(output, "SYMBOL "); break;
        case XML_REGEXP_SYMBOL_MATH:
            fprintf(output, "SYMBOL_MATH "); break;
        case XML_REGEXP_SYMBOL_CURRENCY:
            fprintf(output, "SYMBOL_CURRENCY "); break;
        case XML_REGEXP_SYMBOL_MODIFIER:
            fprintf(output, "SYMBOL_MODIFIER "); break;
        case XML_REGEXP_SYMBOL_OTHERS:
            fprintf(output, "SYMBOL_OTHERS "); break;
        case XML_REGEXP_OTHER:
            fprintf(output, "OTHER "); break;
        case XML_REGEXP_OTHER_CONTROL:
            fprintf(output, "OTHER_CONTROL "); break;
        case XML_REGEXP_OTHER_FORMAT:
            fprintf(output, "OTHER_FORMAT "); break;
        case XML_REGEXP_OTHER_PRIVATE:
            fprintf(output, "OTHER_PRIVATE "); break;
        case XML_REGEXP_OTHER_NA:
            fprintf(output, "OTHER_NA "); break;
        case XML_REGEXP_BLOCK_NAME:
	    fprintf(output, "BLOCK "); break;
    }
}